

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_> __thiscall
anon_unknown.dwarf_b7e868::CreateInstallFilesGenerator
          (anon_unknown_dwarf_b7e868 *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles,cmInstallCommandArguments *args,bool programs,string *destination)

{
  string *__args_2;
  cmInstallCommandArguments *__args_1;
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  string *__args_6;
  string *__args_9;
  undefined1 local_50 [19];
  undefined1 local_3d;
  MessageLevel local_3c;
  string *psStack_38;
  MessageLevel message;
  string *destination_local;
  undefined8 uStack_28;
  bool programs_local;
  cmInstallCommandArguments *args_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *absFiles_local;
  cmMakefile *mf_local;
  
  psStack_38 = destination;
  destination_local._7_1_ = programs;
  uStack_28 = args;
  args_local = (cmInstallCommandArguments *)absFiles;
  absFiles_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)mf;
  mf_local = (cmMakefile *)this;
  local_3c = cmInstallGenerator::SelectMessageLevel(mf,false);
  __args_1 = args_local;
  __args_2 = psStack_38;
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_
                       ((cmInstallCommandArguments *)uStack_28);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                       ((cmInstallCommandArguments *)uStack_28);
  __args_6 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                       ((cmInstallCommandArguments *)uStack_28);
  local_3d = (_Alloc_hider)
             cmInstallCommandArguments::GetExcludeFromAll((cmInstallCommandArguments *)uStack_28);
  __args_9 = cmInstallCommandArguments::GetRename_abi_cxx11_((cmInstallCommandArguments *)uStack_28)
  ;
  local_50[0x12] = cmInstallCommandArguments::GetOptional((cmInstallCommandArguments *)uStack_28);
  cmMakefile::GetBacktrace((cmMakefile *)local_50);
  std::
  make_unique<cmInstallFilesGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string_const&,bool,cmListFileBacktrace>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
             (bool *)__args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&destination_local + 7),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__args_4,__args_5,(MessageLevel *)__args_6,(bool *)&local_3c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d,
             (bool *)__args_9,(cmListFileBacktrace *)(local_50 + 0x12));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_50);
  return (__uniq_ptr_data<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>,_true,_true>
          )(__uniq_ptr_data<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmInstallFilesGenerator> CreateInstallFilesGenerator(
  cmMakefile* mf, const std::vector<std::string>& absFiles,
  const cmInstallCommandArguments& args, bool programs,
  const std::string& destination)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(mf);
  return cm::make_unique<cmInstallFilesGenerator>(
    absFiles, destination, programs, args.GetPermissions(),
    args.GetConfigurations(), args.GetComponent(), message,
    args.GetExcludeFromAll(), args.GetRename(), args.GetOptional(),
    mf->GetBacktrace());
}